

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

int ON_Font::CompareFontCharacteristicsForExperts
              (bool bComparePlatformSpecificCharacteristics,bool bIgnoreUnsetCharacteristics,
              ON_Font *lhs,ON_Font *rhs)

{
  Weight WVar1;
  Weight WVar2;
  Style SVar3;
  bool bVar4;
  Style SVar5;
  uint uVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  ON_wString *pOVar9;
  uint uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  ON_wString rhs_logfont_name;
  ON_wString lhs_logfont_name;
  ON_wString rhs_family_name;
  ON_wString lhs_family_name;
  ON_wString OStack_48;
  ON_wString local_40;
  ON_wString local_38;
  ON_wString local_30;
  
  bVar4 = ON_wString::IsNotEmpty(&lhs->m_loc_family_name);
  pOVar9 = &lhs->m_en_family_name;
  if (bVar4) {
    pOVar9 = &lhs->m_loc_family_name;
  }
  ON_wString::ON_wString(&local_30,pOVar9);
  bVar4 = ON_wString::IsNotEmpty(&rhs->m_loc_family_name);
  pOVar9 = &rhs->m_en_family_name;
  if (bVar4) {
    pOVar9 = &rhs->m_loc_family_name;
  }
  ON_wString::ON_wString(&local_38,pOVar9);
  if ((!bIgnoreUnsetCharacteristics) ||
     ((bVar4 = ON_wString::IsNotEmpty(&local_30), bVar4 &&
      (bVar4 = ON_wString::IsNotEmpty(&local_38), bVar4)))) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_30);
    pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_38);
    uVar6 = ON_wString::CompareOrdinal(pwVar7,pwVar8,true);
    if (uVar6 != 0) {
      uVar11 = 0;
      goto LAB_0048e8f9;
    }
  }
  bVar4 = ON_wString::IsNotEmpty(&lhs->m_loc_windows_logfont_name);
  pOVar9 = &lhs->m_en_windows_logfont_name;
  if (bVar4) {
    pOVar9 = &lhs->m_loc_windows_logfont_name;
  }
  ON_wString::ON_wString(&local_40,pOVar9);
  bVar4 = ON_wString::IsNotEmpty(&rhs->m_loc_windows_logfont_name);
  pOVar9 = &rhs->m_en_windows_logfont_name;
  if (bVar4) {
    pOVar9 = &rhs->m_loc_windows_logfont_name;
  }
  ON_wString::ON_wString(&OStack_48,pOVar9);
  if ((!bIgnoreUnsetCharacteristics) ||
     ((bVar4 = ON_wString::IsNotEmpty(&local_40), bVar4 &&
      (bVar4 = ON_wString::IsNotEmpty(&OStack_48), bVar4)))) {
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_40);
    pwVar8 = ON_wString::operator_cast_to_wchar_t_(&OStack_48);
    uVar6 = ON_wString::CompareOrdinal(pwVar7,pwVar8,true);
    if (uVar6 == 0) goto LAB_0048e793;
    uVar11 = 0;
  }
  else {
LAB_0048e793:
    WVar1 = lhs->m_font_weight;
    WVar2 = rhs->m_font_weight;
    if ((!bIgnoreUnsetCharacteristics) || (WVar2 != Unset && WVar1 != Unset)) {
      uVar11 = (uint)WVar1 * 100;
      if (WVar1 == 0) {
        uVar11 = 400;
      }
      uVar6 = uVar11;
      if (0x351 < uVar11) {
        uVar6 = 900;
      }
      if (uVar11 < 0x96) {
        uVar6 = 100;
      }
      uVar10 = (uint)WVar2 * 100;
      if (WVar2 == 0) {
        uVar10 = 400;
      }
      uVar11 = 900;
      if (uVar10 < 0x352) {
        uVar11 = uVar10;
      }
      if (uVar10 < 0x96) {
        uVar11 = 100;
      }
      if (uVar6 != uVar11) goto LAB_0048e8e7;
    }
    SVar3 = lhs->m_font_style;
    uVar6 = (uint)SVar3;
    SVar5 = rhs->m_font_style;
    if (bIgnoreUnsetCharacteristics) {
      if (SVar3 == SVar5 || (SVar5 == Unset || SVar3 == Unset)) {
LAB_0048e839:
        SVar3 = lhs->m_font_stretch;
        uVar6 = (uint)SVar3;
        SVar5 = rhs->m_font_stretch;
        if (bIgnoreUnsetCharacteristics) {
          if (SVar3 == SVar5 || (SVar5 == Unset || SVar3 == Unset)) {
LAB_0048e867:
            SVar5 = rhs->m_font_bUnderlined;
            uVar6 = (uint)lhs->m_font_bUnderlined;
            if (lhs->m_font_bUnderlined == (bool)SVar5) {
              SVar5 = rhs->m_font_bStrikethrough;
              uVar6 = (uint)lhs->m_font_bStrikethrough;
              if (lhs->m_font_bStrikethrough == (bool)SVar5) {
                dVar13 = lhs->m_point_size;
                dVar12 = (double)(-(ulong)(dVar13 < 10000000000.0) & (ulong)dVar13 &
                                 -(ulong)(0.0 < dVar13));
                dVar13 = rhs->m_point_size;
                dVar13 = (double)(-(ulong)(dVar13 < 10000000000.0) & (ulong)dVar13 &
                                 -(ulong)(0.0 < dVar13));
                if (dVar13 <= dVar12) {
                  uVar6 = (uint)(dVar13 < dVar12);
                }
                else {
                  uVar6 = 0xffffffff;
                }
                SVar5 = Unset;
              }
            }
          }
        }
        else if (SVar3 == SVar5) goto LAB_0048e867;
      }
    }
    else {
      uVar6 = (uint)SVar3;
      if (SVar3 == SVar5) goto LAB_0048e839;
    }
    uVar11 = (uint)SVar5;
  }
LAB_0048e8e7:
  ON_wString::~ON_wString(&OStack_48);
  ON_wString::~ON_wString(&local_40);
LAB_0048e8f9:
  ON_wString::~ON_wString(&local_38);
  ON_wString::~ON_wString(&local_30);
  uVar10 = 0xffffffff;
  if ((int)uVar11 <= (int)uVar6) {
    uVar10 = (uint)((int)uVar11 < (int)uVar6);
  }
  return uVar10;
}

Assistant:

int ON_Font::CompareFontCharacteristicsForExperts(
  bool bComparePlatformSpecificCharacteristics,
  bool bIgnoreUnsetCharacteristics,
  const ON_Font& lhs,
  const ON_Font& rhs
)
{
  int i = 0;
  int j = 0;

  for (;;)
  {
    const ON_wString lhs_family_name = lhs.FamilyName();
    const ON_wString rhs_family_name = rhs.FamilyName();
    const bool bCompareFamilyName =
      false == bIgnoreUnsetCharacteristics
      || (0 != lhs_family_name.IsNotEmpty() && 0 != rhs_family_name.IsNotEmpty());
    if (bCompareFamilyName)
    {
      i = ON_wString::CompareOrdinal(lhs_family_name, rhs_family_name, true);
      j = 0;
      if ( i != j )
        break;
    }

    const ON_wString lhs_logfont_name = lhs.WindowsLogfontName();
    const ON_wString rhs_logfont_name = rhs.WindowsLogfontName();
    const bool bCompareWindowsLogfontName =
      false == bIgnoreUnsetCharacteristics
      || (lhs_logfont_name.IsNotEmpty() && rhs_logfont_name.IsNotEmpty());
    if (bCompareWindowsLogfontName)
    {
      i = ON_wString::CompareOrdinal(lhs_logfont_name, rhs_logfont_name, true);
      j = 0;
      if ( i != j )
        break;
    }

    const ON_Font::Weight lhs_weight = lhs.m_font_weight;
    const ON_Font::Weight rhs_weight = rhs.m_font_weight;
    const bool bCompareWeight =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Weight::Unset != lhs_weight && ON_Font::Weight::Unset != rhs_weight);
    if (bCompareWeight)
    {
      i = ON_Font::WindowsLogfontWeightFromWeight(lhs_weight);
      j = ON_Font::WindowsLogfontWeightFromWeight(rhs_weight);
      if (i != j)
        break;
    }

    const ON_Font::Style lhs_style = lhs.m_font_style;
    const ON_Font::Style rhs_style = rhs.m_font_style;
    const bool bCompareStyle =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Style::Unset != lhs_style && ON_Font::Style::Unset != rhs_style);
    if (bCompareStyle)
    {
      i = static_cast<int>(lhs_style);
      j = static_cast<int>(rhs_style);
      if (i != j)
        break;
    }

    const ON_Font::Stretch lhs_stretch = lhs.m_font_stretch;
    const ON_Font::Stretch rhs_stretch = rhs.m_font_stretch;
    const bool bCompareStretch =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Stretch::Unset != lhs_stretch && ON_Font::Stretch::Unset != rhs_stretch);
    if (bCompareStretch)
    {
      i = static_cast<int>(lhs_stretch);
      j = static_cast<int>(rhs_stretch);
      if (i != j)
        break;
    }

    i = lhs.m_font_bUnderlined ? 1 : 0;
    j = rhs.m_font_bUnderlined ? 1 : 0;
    if ( i != j )
      break;

    i = lhs.m_font_bStrikethrough ? 1 : 0;
    j = rhs.m_font_bStrikethrough ? 1 : 0;
    if ( i != j )
      break;

    const double lhs_point_size = ON_Font::IsValidPointSize(lhs.m_point_size) ? lhs.m_point_size : 0.0;
    const double rhs_point_size = ON_Font::IsValidPointSize(rhs.m_point_size) ? rhs.m_point_size : 0.0;
    j = 0;
    if (lhs_point_size < rhs_point_size)
      i = -1;
    else if (rhs_point_size < lhs_point_size)
      i = 1;
    else
      i = 0;
    if (i != j)
      break;
 
    if (false == bComparePlatformSpecificCharacteristics)
      break;
 
#if defined(ON_RUNTIME_WIN) 
    i = (ON_Font::WindowsConstants::logfont_symbol_charset == lhs.m_logfont_charset) ? 1 : 0;
    j = (ON_Font::WindowsConstants::logfont_symbol_charset == rhs.m_logfont_charset) ? 1 : 0;
    if ( i != j )
      break;
#endif


#if defined(ON_RUNTIME_APPLE)     
  const ON_wString lhs_postscript_name = lhs.PostScriptName();
  const ON_wString rhs_postscript_name = rhs.PostScriptName();
    const bool bComparePostScriptName =
      false == bIgnoreUnsetCharacteristics
      || (lhs_postscript_name.IsNotEmpty() && rhs_postscript_name.IsNotEmpty());
    if (bComparePostScriptName)
    {
      i = ON_wString::CompareOrdinal(lhs_postscript_name, rhs_postscript_name, false);
      if (0 == i)
      {
        if (lhs.m_apple_font_weight_trait < rhs.m_apple_font_weight_trait)
          i = -1;
        else if (lhs.m_apple_font_weight_trait > rhs.m_apple_font_weight_trait)
          i = 1;
      }
      j = 0;
      if (i != j)
        break;
    }
#endif

    break;
  }

  if (i < j)
    return -1;
  if (i > j)
    return 1;

  return 0;
}